

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::ExternInterfaceMethodSyntax::setChild
          (ExternInterfaceMethodSyntax *this,size_t index,TokenOrSyntax child)

{
  long in_RSI;
  
  (*(code *)(&DAT_015b89c8 + *(int *)(&DAT_015b89c8 + in_RSI * 4)))();
  return;
}

Assistant:

void ExternInterfaceMethodSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: externKeyword = child.token(); return;
        case 2: forkJoin = child.token(); return;
        case 3: prototype = child.node() ? &child.node()->as<FunctionPrototypeSyntax>() : nullptr; return;
        case 4: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}